

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

char * lyd_path(lyd_node *node,LYD_PATH_TYPE pathtype,char *buffer,size_t buflen)

{
  lysc_node *plVar1;
  size_t sVar2;
  ly_bool is_static;
  LY_ERR LVar3;
  int iVar4;
  uint uVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  size_t sVar8;
  ly_ht **pplVar9;
  char *pcVar10;
  lyd_node_inner *node_00;
  lys_module *plVar11;
  ly_ctx *ctx;
  lyd_node_inner *plVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  char *buffer_local;
  size_t bufused;
  size_t buflen_local;
  LYD_PATH_TYPE local_3c;
  lyd_node_inner *local_38;
  
  bufused = 0;
  buffer_local = buffer;
  buflen_local = buflen;
  local_3c = pathtype;
  if (node == (lyd_node *)0x0) {
    pcVar13 = "node";
    ctx = (ly_ctx *)0x0;
LAB_00121dfb:
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar13,"lyd_path");
    buffer = (char *)0x0;
  }
  else {
    if (buffer == (char *)0x0) {
      buflen_local = 0;
      is_static = '\0';
    }
    else {
      is_static = '\x01';
      if (buflen < 2) {
        if (node->schema == (lysc_node *)0x0) {
          plVar6 = (lys_module *)&node[2].schema;
        }
        else {
          plVar6 = node->schema->module;
        }
        ctx = plVar6->ctx;
        pcVar13 = "buflen > 1";
        goto LAB_00121dfb;
      }
    }
    if (pathtype < 2) {
      uVar14 = 0;
      plVar12 = (lyd_node_inner *)node;
      do {
        node_00 = plVar12;
        uVar14 = uVar14 + 1;
        plVar12 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10);
        local_38 = (lyd_node_inner *)node;
      } while (*(lyd_node_inner **)((long)&node_00->field_0 + 0x10) != (lyd_node_inner *)0x0);
      while( true ) {
        plVar6 = lyd_node_module((lyd_node *)node_00);
        if (node_00 == (lyd_node_inner *)0x0) {
          plVar12 = (lyd_node_inner *)0x0;
        }
        else {
          plVar12 = (node_00->field_0).node.parent;
        }
        plVar7 = lyd_node_module((lyd_node *)plVar12);
        plVar11 = (lys_module *)0x0;
        if (plVar7 != plVar6) {
          plVar11 = plVar6;
        }
        lVar15 = 1;
        if (plVar11 != (lys_module *)0x0) {
          sVar8 = strlen(plVar11->name);
          lVar15 = sVar8 + 2;
        }
        plVar1 = (node_00->field_0).node.schema;
        pplVar9 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar9 = &node_00->children_ht;
        }
        sVar8 = strlen((char *)*pplVar9);
        sVar2 = bufused;
        LVar3 = lyd_path_str_enlarge(&buffer_local,&buflen_local,lVar15 + bufused + sVar8,is_static)
        ;
        buffer = buffer_local;
        if (LVar3 != LY_SUCCESS) break;
        pcVar13 = "";
        pcVar10 = "";
        if (plVar11 != (lys_module *)0x0) {
          pcVar13 = plVar11->name;
          pcVar10 = ":";
        }
        bVar16 = local_3c == LYD_PATH_STD;
        plVar1 = (node_00->field_0).node.schema;
        pplVar9 = (ly_ht **)&plVar1->name;
        if (plVar1 == (lysc_node *)0x0) {
          pplVar9 = &node_00->children_ht;
        }
        iVar4 = sprintf(buffer_local + sVar2,"/%s%s%s",pcVar13,pcVar10,*pplVar9);
        bufused = (long)iVar4 + sVar2;
        plVar1 = (node_00->field_0).node.schema;
        if ((plVar1 != (lysc_node *)0x0) && (bVar16 || 1 < uVar14)) {
          if (plVar1->nodetype == 8) {
            if ((plVar1->flags & 1) == 0) {
LAB_00121d6e:
              LVar3 = lyd_path_position_predicate
                                ((lyd_node *)node_00,&buffer_local,&buflen_local,&bufused,is_static)
              ;
            }
            else {
              LVar3 = lyd_path_leaflist_predicate
                                ((lyd_node *)node_00,&buffer_local,&buflen_local,&bufused,is_static)
              ;
            }
          }
          else {
            if (plVar1->nodetype != 0x10) goto LAB_00121dac;
            if ((plVar1->flags & 0x200) != 0) goto LAB_00121d6e;
            LVar3 = lyd_path_list_predicate
                              ((lyd_node *)node_00,&buffer_local,&buflen_local,&bufused,is_static);
          }
          if (LVar3 != LY_SUCCESS) {
            return buffer_local;
          }
        }
LAB_00121dac:
        uVar14 = uVar14 - 1;
        if (uVar14 == 0) {
          return buffer_local;
        }
        node_00 = local_38;
        for (uVar5 = 1; uVar5 < uVar14; uVar5 = uVar5 + 1) {
          if (node_00 == (lyd_node_inner *)0x0) {
            node_00 = (lyd_node_inner *)0x0;
          }
          else {
            node_00 = (node_00->field_0).node.parent;
          }
        }
      }
    }
  }
  return buffer;
}

Assistant:

LIBYANG_API_DEF char *
lyd_path(const struct lyd_node *node, LYD_PATH_TYPE pathtype, char *buffer, size_t buflen)
{
    ly_bool is_static = 0;
    uint32_t i, depth;
    size_t bufused = 0, len;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, node, NULL);
    if (buffer) {
        LY_CHECK_ARG_RET(LYD_CTX(node), buflen > 1, NULL);
        is_static = 1;
    } else {
        buflen = 0;
    }

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        depth = 1;
        for (iter = node; iter->parent; iter = lyd_parent(iter)) {
            ++depth;
        }

        goto iter_print;
        while (depth) {
            /* find the right node */
            for (iter = node, i = 1; i < depth; iter = lyd_parent(iter), ++i) {}
iter_print:
            /* get the module */
            mod = lyd_node_module(iter);
            parent = lyd_parent(iter);
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, is_static);
            if (rc != LY_SUCCESS) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc != LY_SUCCESS) {
                break;
            }

            --depth;
        }
        break;
    }

    return buffer;
}